

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osportable.cc
# Opt level: O2

int os_mkdir(char *dir,int create_parents)

{
  char *pcVar1;
  int iVar2;
  size_t __n;
  __uniq_ptr_impl<char,_std::default_delete<char[]>_> __dest;
  char *pcVar3;
  uint uVar4;
  __array tmp;
  char par [4096];
  
  if (*dir == '\0') {
    return 1;
  }
  __n = strlen(dir);
  __dest._M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
  super__Head_base<0UL,_char_*,_false>._M_head_impl =
       (tuple<char_*,_std::default_delete<char[]>_>)operator_new__(__n + 1);
  memset((void *)__dest._M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                 super__Head_base<0UL,_char_*,_false>._M_head_impl,0,__n + 1);
  tmp._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
                 (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
                 __dest._M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                 super__Head_base<0UL,_char_*,_false>._M_head_impl;
  strncpy((char *)__dest._M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                  super__Head_base<0UL,_char_*,_false>._M_head_impl,dir,__n);
  pcVar3 = (char *)((long)__dest._M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                          super__Head_base<0UL,_char_*,_false>._M_head_impl + __n) + 1;
  do {
    pcVar1 = pcVar3 + -2;
    pcVar3 = pcVar3 + -1;
  } while (*pcVar1 == '/');
  *pcVar3 = '\0';
  if ((create_parents != 0) &&
     (pcVar3 = strchr((char *)__dest._M_t.
                              super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                              super__Head_base<0UL,_char_*,_false>._M_head_impl,0x2f),
     pcVar3 != (char *)0x0)) {
    os_get_path_name(par,0x1000,
                     (char *)__dest._M_t.
                             super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                             super__Head_base<0UL,_char_*,_false>._M_head_impl);
    iVar2 = access(par,0);
    __dest._M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
    super__Head_base<0UL,_char_*,_false>._M_head_impl =
         (tuple<char_*,_std::default_delete<char[]>_>)
         (tuple<char_*,_std::default_delete<char[]>_>)tmp;
    if ((iVar2 != 0) &&
       (iVar2 = os_mkdir(par,1),
       __dest._M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
       super__Head_base<0UL,_char_*,_false>._M_head_impl =
            (tuple<char_*,_std::default_delete<char[]>_>)
            (tuple<char_*,_std::default_delete<char[]>_>)tmp, iVar2 == 0)) {
      uVar4 = 0;
      goto LAB_001039ba;
    }
  }
  iVar2 = mkdir((char *)__dest._M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                        super__Head_base<0UL,_char_*,_false>._M_head_impl,0x1ff);
  uVar4 = (uint)(iVar2 == 0);
LAB_001039ba:
  std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(&tmp);
  return uVar4;
}

Assistant:

int
os_mkdir( const char* dir, int create_parents )
{
    //assert(dir != 0);

    if (dir[0] == '\0')
        return true;

    // Copy the directory name to a new string so we can strip any trailing
    // path seperators.
    size_t len = strlen(dir);
    const auto tmp = std::make_unique<char[]>(len + 1);
    strncpy(tmp.get(), dir, len);
    while (tmp[len - 1] == OSPATHCHAR)
        --len;
    tmp[len] = '\0';

    // If we're creating intermediate diretories, and the path contains
    // multiple elements, recursively create the parent directories first.
    if (create_parents and strchr(tmp.get(), OSPATHCHAR) != 0) {
        char par[OSFNMAX];

        // Extract the parent path.
        os_get_path_name(par, sizeof(par), tmp.get());

        // If the parent doesn't already exist, create it recursively.
        if (osfacc(par) != 0 and not os_mkdir(par, true)) {
            return false;
        }
    }

    // Create the directory.
#if HAVE_MKDIR
    return mkdir(tmp.get(), S_IRWXU | S_IRWXG | S_IRWXO) == 0;
#elif HAVE_UNDERSCORE_MKDIR
    return _mkdir(tmp.get()) == 0;
#else
#   error "Neither mkdir() nor _mkdir() is available on this system."
#endif
}